

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

BOOL check_posix_syntax(PCRE2_SPTR8 ptr,PCRE2_SPTR8 ptrend,PCRE2_SPTR8 *endptr)

{
  PCRE2_UCHAR8 PVar1;
  PCRE2_SPTR8 pPVar2;
  PCRE2_SPTR8 pPVar3;
  PCRE2_SPTR8 pPVar4;
  
  if (1 < (long)ptrend - (long)(ptr + 1)) {
    pPVar2 = ptr + 1;
    pPVar3 = ptr;
    do {
      pPVar4 = pPVar2;
      PVar1 = pPVar3[1];
      if (PVar1 == '[') {
        if (pPVar3[2] == *ptr) {
          return 0;
        }
LAB_0018aa7e:
        if ((PVar1 == *ptr) && (pPVar3[2] == ']')) {
          *endptr = pPVar4;
          return 1;
        }
      }
      else {
        if (PVar1 != '\\') {
          if (PVar1 == ']') {
            return 0;
          }
          goto LAB_0018aa7e;
        }
        if ((pPVar3[2] & 0xfe) != 0x5c) goto LAB_0018aa7e;
        pPVar4 = pPVar3 + 2;
      }
      pPVar2 = pPVar4 + 1;
      pPVar3 = pPVar4;
    } while (1 < (long)ptrend - (long)(pPVar4 + 1));
  }
  return 0;
}

Assistant:

static BOOL
check_posix_syntax(PCRE2_SPTR ptr, PCRE2_SPTR ptrend, PCRE2_SPTR *endptr)
{
PCRE2_UCHAR terminator;  /* Don't combine these lines; the Solaris cc */
terminator = *ptr++;     /* compiler warns about "non-constant" initializer. */

for (; ptrend - ptr >= 2; ptr++)
  {
  if (*ptr == CHAR_BACKSLASH &&
      (ptr[1] == CHAR_RIGHT_SQUARE_BRACKET || ptr[1] == CHAR_BACKSLASH))
    ptr++;

  else if ((*ptr == CHAR_LEFT_SQUARE_BRACKET && ptr[1] == terminator) ||
            *ptr == CHAR_RIGHT_SQUARE_BRACKET) return FALSE;

  else if (*ptr == terminator && ptr[1] == CHAR_RIGHT_SQUARE_BRACKET)
    {
    *endptr = ptr;
    return TRUE;
    }
  }

return FALSE;
}